

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

uint64_t __thiscall Catch::ulpDistance<double>(Catch *this,double lhs,double rhs)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  double lhs_00;
  double lhs_01;
  uint64_t local_30;
  uint64_t rc;
  uint64_t lc;
  double rhs_local;
  double lhs_local;
  
  lc = (uint64_t)rhs;
  rhs_local = lhs;
  uVar3 = isnan(lhs);
  if ((uVar3 & 1) != 0) {
    __assert_fail("!Catch::isnan( lhs ) && \"Distance between NaN and number is not meaningful\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x235c,"uint64_t Catch::ulpDistance(FP, FP) [FP = double]");
  }
  uVar3 = isnan((double)lc);
  if ((uVar3 & 1) != 0) {
    __assert_fail("!Catch::isnan( rhs ) && \"Distance between NaN and number is not meaningful\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                  ,0x235e,"uint64_t Catch::ulpDistance(FP, FP) [FP = double]");
  }
  if ((rhs_local != (double)lc) || (NAN(rhs_local) || NAN((double)lc))) {
    if ((rhs_local == 0.0) && (!NAN(rhs_local))) {
      rhs_local = 0.0;
    }
    if (((double)lc == 0.0) && (!NAN((double)lc))) {
      lc = 0;
    }
    bVar1 = std::signbit(rhs_local);
    bVar2 = std::signbit((double)lc);
    if (bVar1 == bVar2) {
      rc = Detail::convertToBits(rhs_local);
      local_30 = Detail::convertToBits((double)lc);
      if (rc < local_30) {
        std::swap<unsigned_long>(&rc,&local_30);
      }
      lhs_local = (double)(rc - local_30);
    }
    else {
      std::abs((int)this);
      uVar4 = ulpDistance<double>(this,lhs_00,0.0);
      std::abs((int)this);
      uVar5 = ulpDistance<double>(this,lhs_01,0.0);
      lhs_local = (double)(uVar4 + uVar5);
    }
  }
  else {
    lhs_local = 0.0;
  }
  return (uint64_t)lhs_local;
}

Assistant:

uint64_t ulpDistance( FP lhs, FP rhs ) {
        assert( std::numeric_limits<FP>::is_iec559 &&
            "ulpDistance assumes IEEE-754 format for floating point types" );
        assert( !Catch::isnan( lhs ) &&
                "Distance between NaN and number is not meaningful" );
        assert( !Catch::isnan( rhs ) &&
                "Distance between NaN and number is not meaningful" );

        // We want X == Y to imply 0 ULP distance even if X and Y aren't
        // bit-equal (-0 and 0), or X - Y != 0 (same sign infinities).
        if ( lhs == rhs ) { return 0; }

        // We need a properly typed positive zero for type inference.
        static constexpr FP positive_zero{};

        // We want to ensure that +/- 0 is always represented as positive zero
        if ( lhs == positive_zero ) { lhs = positive_zero; }
        if ( rhs == positive_zero ) { rhs = positive_zero; }

        // If arguments have different signs, we can handle them by summing
        // how far are they from 0 each.
        if ( std::signbit( lhs ) != std::signbit( rhs ) ) {
            return ulpDistance( std::abs( lhs ), positive_zero ) +
                   ulpDistance( std::abs( rhs ), positive_zero );
        }

        // When both lhs and rhs are of the same sign, we can just
        // read the numbers bitwise as integers, and then subtract them
        // (assuming IEEE).
        uint64_t lc = Detail::convertToBits( lhs );
        uint64_t rc = Detail::convertToBits( rhs );

        // The ulp distance between two numbers is symmetric, so to avoid
        // dealing with overflows we want the bigger converted number on the lhs
        if ( lc < rc ) {
            std::swap( lc, rc );
        }

        return lc - rc;
    }